

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadFurBall(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer *ppTVar1;
  _Rb_tree_color *p_Var2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  FILE *pFVar5;
  float *pfVar6;
  XML *pXVar7;
  avector<Vec3ff> *paVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint3 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  HairSetNode *this_00;
  element_type *peVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  GroupNode *this_01;
  TriangleMeshNode *pTVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  string *psVar21;
  HairSetNode *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  long lVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  TriangleMeshNode *pTVar28;
  _Base_ptr p_Var29;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *puVar30;
  Vec3fx *extraout_RDX_00;
  Vec3fx *sig;
  Vec3fx *extraout_RDX_01;
  Vec3fx *extraout_RDX_02;
  Vec3fx *extraout_RDX_03;
  Vec3fx *extraout_RDX_04;
  int iVar31;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  avector<Vec3ff> *paVar32;
  undefined4 uVar33;
  uint uVar34;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_03;
  iterator iVar35;
  avector<Vec3ff> *ctx;
  pointer in_R8;
  size_t in_R9;
  long lVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  float fVar40;
  size_type sVar41;
  ulong uVar42;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *pvVar43;
  __atomic_base<unsigned_long> _Var44;
  __atomic_base<unsigned_long> _Var45;
  __atomic_base<unsigned_long> _Var46;
  _Alloc_hider _Var47;
  bool bVar48;
  bool bVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Dc;
  float fVar53;
  float extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  float fVar54;
  float fVar55;
  float fVar56;
  vfloat4 a_5;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  vfloat4 a;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [16];
  vfloat4 a_4;
  undefined1 auVar70 [16];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [16];
  vfloat4 a_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  vfloat4 a_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  vfloat4 a0;
  string phairtype;
  Ref<embree::SceneGraph::MaterialNode> material;
  int offset_a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  byte local_308;
  string local_2f8;
  TriangleMeshNode *local_2d8;
  string local_2d0;
  Ref<embree::XML> *local_2b0;
  ulong local_2a8;
  uchar *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [48];
  _Alloc_hider local_238;
  undefined1 local_230 [72];
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  HairSetNode *local_1b8;
  Ref<embree::SceneGraph::MaterialNode> local_1b0;
  Ref<embree::SceneGraph::MaterialNode> local_1a8 [2];
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined8 local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  XMLLoader *local_158;
  avector<Vec3ff> *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  long local_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  undefined1 local_48 [16];
  avector<Vec3ff> *siglen;
  undefined1 auVar86 [16];
  
  local_288._8_8_ = local_288._0_8_;
  local_2b0 = xml;
  local_158 = this;
  this_01 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_01,0);
  local_238._M_p = (pointer)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  pXVar7 = (XML *)*in_RDX;
  paVar22 = &local_2f8.field_2;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"radius","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar16 == 0) {
    local_278 = 10.0;
    fStack_274 = 0.0;
    fStack_270 = 0.0;
    fStack_26c = 0.0;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"radius","");
    local_278 = XML::parm_float(pXVar7,&local_68);
    fStack_274 = extraout_XMM0_Db;
    fStack_270 = extraout_XMM0_Dc;
    fStack_26c = extraout_XMM0_Dd;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"slices","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar16 == 0) {
    local_288._0_8_ = 0x3c;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"slices","");
    fVar50 = XML::parm_float(pXVar7,&local_88);
    local_288._0_8_ = ZEXT48((uint)(int)fVar50);
  }
  if ((iVar16 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"slabs","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar16 == 0) {
    local_2a0 = (uchar *)0x3c;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"slabs","");
    fVar50 = XML::parm_float(pXVar7,&local_a8);
    local_2a0 = (uchar *)(ulong)(uint)(int)fVar50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"nhairs","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar16 == 0) {
    local_2a8 = 30000;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"nhairs","");
    fVar50 = XML::parm_float(pXVar7,&local_c8);
    local_2a8 = (ulong)(uint)(int)fVar50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"hairwidth","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar16 == 0) {
    local_128 = local_278 / 100.0;
    fStack_124 = fStack_274;
    fStack_120 = fStack_270;
    fStack_11c = fStack_26c;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"hairwidth","");
    fVar50 = XML::parm_float(pXVar7,&local_e8);
    local_128 = (float)(int)fVar50;
    fStack_124 = (float)(int)extraout_var._0_4_;
    fStack_120 = (float)(int)extraout_var._4_4_;
    fStack_11c = (float)(int)extraout_var._8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"hairlength","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar16 == 0) {
    local_148 = local_278 / 10.0;
    fStack_144 = fStack_274;
    fStack_140 = fStack_270;
    fStack_13c = fStack_26c;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"hairlength","");
    fVar50 = XML::parm_float(pXVar7,&local_108);
    local_148 = (float)(int)fVar50;
    fStack_144 = (float)(int)extraout_var_00._0_4_;
    fStack_140 = (float)(int)extraout_var_00._4_4_;
    fStack_13c = (float)(int)extraout_var_00._8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"hairtype","");
  XML::parm(&local_2d0,pXVar7,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
  bVar48 = true;
  if (iVar17 == 0) {
    local_298 = 2.38221e-44;
LAB_00187b3e:
    bVar9 = false;
LAB_00187b68:
    bVar24 = 0;
LAB_00187b70:
    bVar25 = 0;
LAB_00187b78:
    uVar33 = 0;
  }
  else {
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      local_298 = 2.24208e-44;
      goto LAB_00187b3e;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    bVar9 = true;
    if (iVar17 == 0) {
      local_298 = 3.50325e-44;
LAB_00187b60:
      bVar48 = false;
      goto LAB_00187b68;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      local_298 = 3.36312e-44;
      goto LAB_00187b60;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      bVar9 = true;
      local_298 = 3.64338e-44;
      bVar24 = 0;
LAB_001890e0:
      bVar25 = 0;
LAB_001890e8:
      uVar33 = 0;
      uVar18 = 1;
LAB_001890ec:
      local_308 = (byte)uVar18;
      bVar48 = false;
      goto LAB_00187b82;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    bVar24 = 1;
    if (iVar17 == 0) {
      local_298 = 4.62428e-44;
LAB_0018910d:
      bVar48 = false;
      bVar9 = false;
      goto LAB_00187b70;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      local_298 = 4.48416e-44;
      goto LAB_0018910d;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      bVar24 = 1;
      local_298 = 4.76441e-44;
      bVar9 = false;
      goto LAB_001890e0;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    bVar25 = 1;
    if (iVar17 == 0) {
      local_298 = 5.74532e-44;
LAB_0018915d:
      bVar48 = false;
      bVar9 = false;
      bVar24 = 0;
      goto LAB_00187b78;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      local_298 = 5.60519e-44;
      goto LAB_0018915d;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    if (iVar17 == 0) {
      bVar25 = 1;
      local_298 = 5.88545e-44;
      bVar9 = false;
      bVar24 = 0;
      goto LAB_001890e8;
    }
    iVar17 = std::__cxx11::string::compare((char *)&local_2d0);
    uVar12 = (uint3)((uint)iVar16 >> 8);
    uVar33 = (undefined4)CONCAT71((uint7)uVar12,1);
    if (iVar17 == 0) {
      local_298 = 8.26766e-44;
    }
    else {
      iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
      if (iVar16 != 0) {
        iVar16 = std::__cxx11::string::compare((char *)&local_2d0);
        bVar48 = iVar16 == 0;
        uVar18._1_3_ = uVar12;
        uVar18._0_1_ = bVar48;
        bVar9 = !bVar48;
        local_298 = 3.36312e-44;
        if (bVar48) {
          local_298 = 8.40779e-44;
        }
        bVar24 = 0;
        bVar25 = 0;
        uVar33 = uVar18;
        goto LAB_001890ec;
      }
      local_298 = 8.12753e-44;
    }
    bVar48 = false;
    bVar9 = false;
    bVar24 = 0;
    bVar25 = 0;
  }
  local_308 = 0;
LAB_00187b82:
  psVar21 = (string *)*in_RDX;
  local_2f8._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"material","");
  XML::child((XML *)local_268,psVar21);
  auVar92 = local_288;
  loadMaterial((XMLLoader *)local_230,local_2b0);
  if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_268._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar22) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  pTVar19 = (TriangleMeshNode *)operator_new(0xd8);
  local_1a8[0].ptr = (MaterialNode *)local_230._0_8_;
  local_2d8 = pTVar19;
  if ((long *)local_230._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_230._0_8_ + 0x10))();
  }
  SceneGraph::TriangleMeshNode::TriangleMeshNode(pTVar19,local_1a8,(BBox1f)0x3f80000000000000,0);
  (*(pTVar19->super_Node).super_RefCount._vptr_RefCount[2])(pTVar19);
  local_1a8[1].ptr._4_4_ = uVar33;
  if (local_1a8[0].ptr != (MaterialNode *)0x0) {
    (*((local_1a8[0].ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar34 = (int)local_2a0 - 1;
  iVar16 = uVar34 * auVar92._0_4_ + 2;
  sVar41 = (size_type)iVar16;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_2f8.field_2._8_8_ = (undefined1 (*) [16])0x0;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&local_2f8._M_string_length;
  if (iVar16 != 0) {
    local_2f8.field_2._8_8_ = alignedMalloc(sVar41 << 4,0x10);
    alignedFree((void *)0x0);
    paVar20 = paVar22;
    local_2f8._M_string_length = sVar41;
  }
  paVar20->_M_allocated_capacity = sVar41;
  _local_198 = ZEXT416((uint)-local_278) << 0x20;
  *(undefined1 (*) [16])local_2f8.field_2._8_8_ = _local_198;
  uVar42 = 0;
  fVar50 = local_278;
  if (1 < (int)local_2a0) {
    uVar33 = local_288._0_4_;
    local_1e8 = (string *)CONCAT44(local_1e8._4_4_,3.1415927 / (float)(int)local_2a0);
    fVar59 = 3.1415927 / (float)(int)local_288._0_4_ + 3.1415927 / (float)(int)local_288._0_4_;
    iVar16 = 0;
    local_188 = (_Base_ptr)CONCAT44(local_188._4_4_,fVar59);
    do {
      uVar39 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar39;
      if (0 < (int)local_288._0_4_) {
        local_2b0 = (Ref<embree::XML> *)
                    CONCAT44(local_2b0._4_4_,(float)(int)uVar39 * (float)local_1e8);
        lVar36 = (long)iVar16 << 4;
        iVar17 = 0;
        do {
          local_268._32_4_ = (float)iVar17 * fVar59;
          fVar50 = sinf(local_2b0._0_4_);
          local_1c8._0_4_ = fVar50 * local_278;
          fVar50 = cosf((float)local_268._32_4_);
          _local_1c8 = ZEXT416((uint)(fVar50 * (float)local_1c8._0_4_));
          local_1d8 = sinf(local_2b0._0_4_);
          local_1d8 = local_1d8 * local_278;
          local_268._32_4_ = sinf((float)local_268._32_4_);
          fVar50 = cosf(local_2b0._0_4_);
          p_Var2 = (_Rb_tree_color *)(local_2f8.field_2._8_8_ + lVar36);
          *p_Var2 = local_1c8._0_4_;
          p_Var2[1] = (_Rb_tree_color)(fVar50 * local_278);
          p_Var2[2] = (_Rb_tree_color)((float)local_268._32_4_ * local_1d8);
          p_Var2[3] = (_Rb_tree_color)fStack_1bc;
          iVar17 = iVar17 + 1;
          lVar36 = lVar36 + 0x10;
          fVar59 = (float)local_188;
        } while (uVar33 != iVar17);
        iVar16 = iVar16 + iVar17;
        pTVar19 = local_2d8;
        fVar50 = local_278;
      }
    } while (uVar39 != uVar34);
    uVar42 = (ulong)iVar16;
  }
  iVar35._M_current = (Triangle *)&local_2f8;
  *(undefined1 (*) [16])(local_2f8.field_2._8_8_ + uVar42 * 0x10) = ZEXT416((uint)fVar50) << 0x20;
  *(undefined1 (*) [8])((undefined1 (*) [16])(local_2f8.field_2._8_8_ + 0x10))[uVar42] = local_198;
  *(_Base_ptr *)(((undefined1 (*) [16])(local_2f8.field_2._8_8_ + 0x10))[uVar42] + 8) = uStack_190;
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::push_back(&pTVar19->positions,(value_type *)iVar35._M_current);
  alignedFree((void *)local_2f8.field_2._8_8_);
  auVar92 = _local_198;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_2f8.field_2._8_8_ = 0;
  uVar34 = (uint)(pTVar19->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].size_active;
  local_198._4_4_ = 0;
  local_198._0_4_ = uVar34;
  uStack_190 = auVar92._8_8_;
  uVar39 = local_288._0_4_;
  if (0 < (int)uVar39) {
    pvVar43 = &local_2d8->triangles;
    uVar37 = 1;
    do {
      uVar26 = uVar37;
      if (uVar37 == uVar39) {
        uVar26 = 0;
      }
      local_2f8._M_dataplus._M_p._4_4_ = uVar37 - 1;
      local_2f8._M_dataplus._M_p._0_4_ = uVar34 - 2;
      local_2f8._M_string_length = CONCAT44(local_2f8._M_string_length._4_4_,uVar26);
      iVar35._M_current =
           (local_2d8->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar35._M_current ==
          (local_2d8->triangles).
          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (pvVar43,iVar35,(Triangle *)&local_2f8);
      }
      else {
        (iVar35._M_current)->v2 = uVar26;
        *(pointer *)iVar35._M_current = local_2f8._M_dataplus._M_p;
        ppTVar1 = &(local_2d8->triangles).
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      bVar49 = uVar37 != uVar39;
      uVar37 = uVar37 + 1;
    } while (bVar49);
  }
  pTVar19 = local_2d8;
  pTVar28 = (TriangleMeshNode *)local_288._0_8_;
  if (2 < (int)local_2a0) {
    local_188 = (_Base_ptr)&local_2d8->triangles;
    local_2a0 = (uchar *)(ulong)((int)local_2a0 - 3);
    fVar50 = local_288._0_4_;
    local_2b0 = (Ref<embree::XML> *)0x0;
    local_1e8 = (string *)0x0;
    local_268._32_4_ = fVar50;
    do {
      auVar92 = _local_1c8;
      if (0 < (int)local_288._0_8_) {
        local_1d8 = (float)((int)local_1e8 * local_288._0_4_);
        local_1c8._4_4_ = 0;
        local_1c8._0_4_ = ((int)local_1e8 + 1) * local_288._0_4_;
        _fStack_1c0 = auVar92._8_8_;
        fVar59 = 0.0;
        do {
          iVar16 = (int)local_2b0 + (int)fVar59;
          fVar40 = (float)((int)fVar59 + 1);
          fVar52 = fVar40;
          if ((int)fVar59 - (int)fVar50 == -1) {
            fVar52 = 0.0;
          }
          uVar34 = (int)fVar52 + local_1c8._0_4_;
          local_2f8._M_dataplus._M_p._4_4_ = (int)fVar59 + local_268._32_4_;
          local_2f8._M_dataplus._M_p._0_4_ = iVar16;
          iVar35._M_current =
               (pTVar19->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar35._M_current ==
              (pTVar19->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_2f8._M_string_length._0_4_ = uVar34;
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_188,iVar35,(Triangle *)&local_2f8);
          }
          else {
            (iVar35._M_current)->v2 = uVar34;
            *(pointer *)iVar35._M_current = local_2f8._M_dataplus._M_p;
            ppTVar1 = &(pTVar19->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          local_2f8._M_dataplus._M_p._4_4_ = uVar34;
          local_2f8._M_string_length =
               CONCAT44(local_2f8._M_string_length._4_4_,(int)fVar52 + (int)local_1d8);
          iVar35._M_current =
               (pTVar19->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar35._M_current ==
              (pTVar19->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_188,iVar35,(Triangle *)&local_2f8);
          }
          else {
            (iVar35._M_current)->v2 = (int)fVar52 + (int)local_1d8;
            *(pointer *)iVar35._M_current = local_2f8._M_dataplus._M_p;
            ppTVar1 = &(pTVar19->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          fVar59 = fVar40;
        } while (fVar40 != fVar50);
      }
      iVar16 = (int)local_1e8;
      psVar21 = (string *)(ulong)(iVar16 + 1);
      local_268._32_4_ = local_268._32_4_ + local_288._0_4_;
      local_2b0 = (Ref<embree::XML> *)(ulong)(uint)((int)local_2b0 + local_288._0_4_);
      pTVar28 = (TriangleMeshNode *)local_288._0_8_;
      iVar35._M_current = (Triangle *)local_1e8;
      local_1e8 = psVar21;
    } while (iVar16 != (int)local_2a0);
  }
  puVar30 = local_2a0;
  if (0 < (int)pTVar28) {
    iVar17 = local_198._0_4_ + -1;
    uVar34 = local_288._0_4_;
    iVar31 = ~uVar34 + iVar17;
    pvVar43 = &local_2d8->triangles;
    iVar16 = 0;
    do {
      iVar38 = iVar16 + 1;
      iVar27 = iVar38;
      if (uVar34 - 1 == iVar16) {
        iVar27 = 0;
      }
      uVar39 = iVar27 + iVar31;
      local_2f8._M_dataplus._M_p._4_4_ = iVar16 + iVar31;
      local_2f8._M_dataplus._M_p._0_4_ = iVar17;
      local_2f8._M_string_length = CONCAT44(local_2f8._M_string_length._4_4_,uVar39);
      iVar35._M_current =
           (local_2d8->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pTVar28 = local_2d8;
      if (iVar35._M_current ==
          (local_2d8->triangles).
          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (pvVar43,iVar35,(Triangle *)&local_2f8);
        puVar30 = extraout_RDX;
      }
      else {
        (iVar35._M_current)->v2 = uVar39;
        *(pointer *)iVar35._M_current = local_2f8._M_dataplus._M_p;
        ppTVar1 = &(local_2d8->triangles).
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      iVar16 = iVar38;
    } while (local_288._0_4_ != iVar38);
  }
  pTVar19 = local_2d8;
  SceneGraph::TriangleMeshNode::verify
            (local_2d8,(EVP_PKEY_CTX *)iVar35._M_current,puVar30,(size_t)pTVar28,(uchar *)in_R8,
             in_R9);
  _Var47._M_p = local_238._M_p;
  local_2f8._M_dataplus._M_p = (pointer)pTVar19;
  (*(pTVar19->super_Node).super_RefCount._vptr_RefCount[2])(pTVar19);
  if ((TriangleMeshNode *)local_2f8._M_dataplus._M_p != (TriangleMeshNode *)0x0) {
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::push_back((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                 *)(_Var47._M_p + 0x68),(value_type *)&local_2f8);
  }
  if ((TriangleMeshNode *)local_2f8._M_dataplus._M_p != (TriangleMeshNode *)0x0) {
    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 0x18))();
  }
  this_02 = (HairSetNode *)operator_new(0x118);
  local_1b0.ptr = (MaterialNode *)local_230._0_8_;
  local_1b8 = this_02;
  if ((long *)local_230._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_230._0_8_ + 0x10))();
  }
  SceneGraph::HairSetNode::HairSetNode
            (this_02,(RTCGeometryType)local_298,&local_1b0,(BBox1f)0x3f80000000000000,0);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  if ((_Base_ptr)local_1b0.ptr != (_Base_ptr)0x0) {
    (*((local_1b0.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&local_2f8._M_string_length;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_2f8.field_2._8_8_ = (void *)0x0;
  local_268._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268._8_8_ = 0;
  local_268._16_8_ = (element_type *)0x0;
  local_230._64_8_ = (void *)0x0;
  local_230._48_8_ = (_Base_ptr)0x0;
  local_230._56_8_ = (_Base_ptr)0x0;
  local_150 = (avector<Vec3ff> *)(long)(int)local_2a8;
  lVar36 = 2 - (ulong)bVar25;
  _Var44._M_i = (long)local_150 << ((byte)lVar36 & 0x3f);
  local_230._32_8_ = (FILE *)0x0;
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  if ((int)local_2a8 != 0) {
    local_2f8.field_2._8_8_ = alignedMalloc(_Var44._M_i << 4,0x10);
    alignedFree((void *)0x0);
    paVar22 = &local_2f8.field_2;
    local_2f8._M_string_length = _Var44._M_i;
  }
  uVar14 = local_268._24_8_;
  paVar22->_M_allocated_capacity = _Var44._M_i;
  _Var45._M_i = local_268._16_8_;
  if (((ulong)local_268._16_8_ < _Var44._M_i) &&
     (_Var45._M_i = _Var44._M_i, peVar15 = (element_type *)local_268._16_8_,
     (element_type *)local_268._16_8_ != (element_type *)0x0)) {
    while (_Var45._M_i = (__int_type)peVar15, _Var45._M_i < _Var44._M_i) {
      peVar15 = (element_type *)(_Var45._M_i * 2 + (ulong)(_Var45._M_i * 2 == 0));
    }
  }
  if (_Var44._M_i < (ulong)local_268._8_8_) {
    local_268._8_8_ = _Var44._M_i;
  }
  if (local_268._16_8_ != _Var45._M_i) {
    local_268._24_8_ = alignedMalloc(_Var45._M_i << 4,0x10);
    if (local_268._8_8_ != 0) {
      lVar23 = 0;
      uVar42 = 0;
      do {
        puVar4 = (undefined8 *)((long)(_func_int ***)uVar14 + lVar23);
        uVar13 = puVar4[1];
        puVar3 = (undefined8 *)
                 ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._24_8_)->
                         _vptr__Sp_counted_base + lVar23);
        *puVar3 = *puVar4;
        puVar3[1] = uVar13;
        uVar42 = uVar42 + 1;
        lVar23 = lVar23 + 0x10;
      } while (uVar42 < (ulong)local_268._8_8_);
    }
    alignedFree((void *)uVar14);
    local_268._16_8_ = _Var45._M_i;
  }
  uVar14 = local_230._64_8_;
  local_268._8_8_ = _Var44._M_i;
  _Var45._M_i = local_230._16_8_;
  if (bVar25 != 0) {
    _Var45._M_i = local_230._56_8_;
    if (((ulong)local_230._56_8_ < _Var44._M_i) &&
       (_Var45._M_i = _Var44._M_i, p_Var29 = (_Base_ptr)local_230._56_8_,
       (_Base_ptr)local_230._56_8_ != (_Base_ptr)0x0)) {
      while (_Var45._M_i = (__int_type)p_Var29, _Var45._M_i < _Var44._M_i) {
        p_Var29 = (_Base_ptr)(_Var45._M_i * 2 + (ulong)(_Var45._M_i * 2 == 0));
      }
    }
    if (_Var44._M_i < (ulong)local_230._48_8_) {
      local_230._48_8_ = _Var44._M_i;
    }
    if (local_230._56_8_ != _Var45._M_i) {
      local_230._64_8_ = alignedMalloc(_Var45._M_i << 4,0x10);
      if ((_Base_ptr)local_230._48_8_ != (_Base_ptr)0x0) {
        lVar23 = 0;
        p_Var29 = (_Base_ptr)0x0;
        do {
          puVar4 = (undefined8 *)(uVar14 + lVar23);
          uVar13 = puVar4[1];
          *(undefined8 *)(local_230._64_8_ + lVar23) = *puVar4;
          ((undefined8 *)(local_230._64_8_ + lVar23))[1] = uVar13;
          p_Var29 = (_Base_ptr)((long)&p_Var29->_M_color + 1);
          lVar23 = lVar23 + 0x10;
        } while (p_Var29 < (ulong)local_230._48_8_);
      }
      alignedFree((void *)uVar14);
      local_230._56_8_ = _Var45._M_i;
    }
    uVar14 = local_230._32_8_;
    _Var46._M_i = local_230._24_8_;
    if (((ulong)local_230._24_8_ < _Var44._M_i) &&
       (_Var46._M_i = _Var44._M_i, uVar42 = local_230._24_8_, local_230._24_8_ != 0)) {
      while (_Var46._M_i = uVar42, _Var46._M_i < _Var44._M_i) {
        uVar42 = _Var46._M_i * 2 + (ulong)(_Var46._M_i * 2 == 0);
      }
    }
    if (_Var44._M_i < (ulong)local_230._16_8_) {
      local_230._16_8_ = _Var44._M_i;
    }
    _Var45._M_i = _Var44._M_i;
    local_230._48_8_ = _Var44._M_i;
    if (local_230._24_8_ != _Var46._M_i) {
      local_230._32_8_ = alignedMalloc(_Var46._M_i << 4,0x10);
      if (local_230._16_8_ != 0) {
        lVar23 = 0;
        uVar42 = 0;
        do {
          pFVar5 = (FILE *)(uVar14 + lVar23);
          uVar13 = *(undefined8 *)(pFVar5 + 8);
          *(undefined8 *)(local_230._32_8_ + lVar23) = *(undefined8 *)pFVar5;
          *(undefined8 *)((FILE *)(local_230._32_8_ + lVar23) + 8) = uVar13;
          uVar42 = uVar42 + 1;
          lVar23 = lVar23 + 0x10;
        } while (uVar42 < (ulong)local_230._16_8_);
      }
      alignedFree((void *)uVar14);
      local_230._24_8_ = _Var46._M_i;
    }
  }
  local_230._16_8_ = _Var45._M_i;
  local_110 = lVar36;
  if (0 < (int)local_2a8) {
    fStack_274 = local_278;
    fStack_270 = local_278;
    fStack_26c = local_278;
    fStack_1e0 = local_148 * -0.01 + 1.0;
    local_1e8 = (string *)CONCAT44(fStack_1e0,fStack_1e0);
    local_2a0 = (uchar *)CONCAT44(local_2a0._4_4_,local_148 * 0.03);
    local_198._4_4_ = local_148 * 0.03 + 1.0;
    local_198._0_4_ = local_198._4_4_;
    uStack_190._0_4_ = (float)local_198._4_4_;
    uStack_190._4_4_ = (float)local_198._4_4_;
    local_298 = local_148 * 0.07 + 1.0;
    local_288 = ZEXT416((uint)local_298);
    local_138 = local_148;
    fStack_134 = local_148;
    fStack_130 = local_148;
    fStack_12c = local_148;
    local_48 = ZEXT416((uint)(local_128 * 0.5));
    uVar42 = local_2a8 & 0xffffffff;
    uVar34 = 0x7a864a0;
    fVar50 = 0.36814472;
    fVar59 = 0.88034713;
    fVar52 = 0.29909593;
    fVar40 = 0.0;
    lVar36 = 0;
    fStack_294 = local_298;
    fStack_290 = local_298;
    fStack_28c = local_298;
    fStack_1dc = fStack_1e0;
    local_148 = local_148 * 0.13;
    do {
      local_1c8._4_4_ = fVar59;
      local_1c8._0_4_ = fVar50;
      fStack_1c0 = fVar52;
      fStack_1bc = fVar40;
      local_2b0 = (Ref<embree::XML> *)
                  CONCAT44(local_2b0._4_4_,
                           (float)(uVar34 * 0x41c64e6d + 0x3039 & 0x7fffffff) * 4.656613e-10 *
                           6.2831855);
      fVar50 = (float)(uVar34 * -0x3d5d6597 + 0xd3dc167e & 0x7fffffff) * 4.656613e-10;
      local_268._32_4_ = acosf(1.0 - (fVar50 + fVar50));
      local_1d8 = sinf((float)local_268._32_4_);
      fVar50 = cosf(local_2b0._0_4_);
      local_188 = (_Base_ptr)CONCAT44(extraout_XMM0_Db_00,fVar50 * local_1d8);
      local_1d8 = cosf((float)local_268._32_4_);
      local_268._32_4_ = sinf((float)local_268._32_4_);
      fVar51 = sinf(local_2b0._0_4_);
      fVar51 = fVar51 * (float)local_268._32_4_;
      fVar52 = (float)local_1c8._4_4_ * (float)local_188 - (float)local_1c8._0_4_ * local_1d8;
      fVar50 = fStack_1c0 * local_1d8 - (float)local_1c8._4_4_ * fVar51;
      fVar59 = (float)local_1c8._0_4_ * fVar51 - fStack_1c0 * (float)local_188;
      fVar54 = fStack_1bc * 0.0 - fStack_1bc * 0.0;
      fVar40 = fVar50 * fVar50;
      fVar53 = fVar59 * fVar59;
      fVar55 = fVar54 * fVar54;
      fVar64 = fVar53 + fVar40 + fVar52 * fVar52;
      auVar85._0_8_ = CONCAT44(fVar55 + fVar40 + fVar40,fVar64);
      auVar85._8_4_ = fVar53 + fVar40 + fVar53;
      auVar85._12_4_ = fVar55 + fVar40 + fVar55;
      auVar91._8_4_ = auVar85._8_4_;
      auVar91._0_8_ = auVar85._0_8_;
      auVar91._12_4_ = auVar85._12_4_;
      auVar92 = rsqrtss(auVar91,auVar85);
      fVar40 = auVar92._0_4_;
      fVar40 = fVar40 * fVar40 * fVar64 * -0.5 * fVar40 + fVar40 * 1.5;
      fVar50 = fVar40 * fVar50;
      fVar59 = fVar40 * fVar59;
      fVar52 = fVar40 * fVar52;
      fVar40 = fVar40 * fVar54;
      fVar65 = local_278 * (float)local_188;
      fVar67 = fStack_274 * local_1d8;
      fVar68 = fStack_270 * fVar51;
      fVar69 = fStack_26c * 0.0;
      fVar60 = (float)local_198._0_4_ * fVar65;
      fVar61 = (float)local_198._4_4_ * fVar67;
      fVar62 = (float)uStack_190 * fVar68;
      fVar63 = uStack_190._4_4_ * fVar69;
      uVar39 = uVar34 * -0x7f82434b + 0xa70427df;
      uVar34 = uVar39 & 0x7fffffff;
      fVar53 = local_298 * fVar65;
      fVar54 = fStack_294 * fVar67;
      fVar55 = fStack_290 * fVar68;
      fVar64 = fStack_28c * fVar69;
      fVar56 = (float)uVar34 * 4.656613e-10 * local_2a0._0_4_ + (float)local_288._0_4_;
      auVar92._0_4_ = fVar56 * fVar65;
      auVar92._4_4_ = fVar56 * fVar67;
      auVar92._8_4_ = fVar56 * fVar68;
      auVar92._12_4_ = fVar56 * fVar69;
      if (bVar9) {
        fVar71 = local_278 * fVar50 * 0.051 * local_138;
        fVar73 = fStack_274 * fVar59 * 0.051 * fStack_134;
        fVar74 = fStack_270 * fVar52 * 0.051 * fStack_130;
        fVar56 = fStack_26c * fVar40 * 0.051 * fStack_12c;
LAB_00188912:
        auVar57._0_4_ = auVar92._0_4_ + fVar71;
        auVar57._4_4_ = auVar92._4_4_ + fVar73;
        auVar57._8_4_ = auVar92._8_4_ + fVar74;
        auVar57._12_4_ = auVar92._12_4_ + fVar56;
        auVar92 = auVar57;
      }
      else {
        if (bVar48) {
          fVar56 = local_278 * fVar50;
          fVar73 = fStack_274 * fVar59;
          fVar74 = fStack_270 * fVar52;
          fVar83 = fStack_26c * fVar40;
          fVar60 = fVar60 + fVar56 * 0.001 * local_138;
          fVar61 = fVar61 + fVar73 * 0.001 * fStack_134;
          fVar62 = fVar62 + fVar74 * 0.001 * fStack_130;
          fVar63 = fVar63 + fVar83 * 0.001 * fStack_12c;
          fVar53 = fVar53 + fVar56 * 0.021 * local_138;
          fVar54 = fVar54 + fVar73 * 0.021 * fStack_134;
          fVar55 = fVar55 + fVar74 * 0.021 * fStack_130;
          fVar64 = fVar64 + fVar83 * 0.021 * fStack_12c;
          fVar71 = fVar56 * 0.051 * local_138;
          fVar73 = fVar73 * 0.051 * fStack_134;
          fVar74 = fVar74 * 0.051 * fStack_130;
          fVar56 = fVar83 * 0.051 * fStack_12c;
          goto LAB_00188912;
        }
        if (bVar24 != 0) {
          fVar53 = fVar53 + local_278 * fVar50 * 0.021 * local_138;
          fVar54 = fVar54 + fStack_274 * fVar59 * 0.021 * fStack_134;
          fVar55 = fVar55 + fStack_270 * fVar52 * 0.021 * fStack_130;
          fVar64 = fVar64 + fStack_26c * fVar40 * 0.021 * fStack_12c;
          uVar34 = uVar39 * 0x41c64e6d + 0x3039 & 0x7fffffff;
          fVar56 = (float)uVar34 * 4.656613e-10 * local_148 + (float)local_288._0_4_;
          fVar71 = fVar56 * fVar65;
          fVar73 = fVar56 * fVar67;
          fVar74 = fVar56 * fVar68;
          fVar56 = fVar56 * fVar69;
          auVar92._0_4_ = local_278 * fVar50 * 0.081 * local_138;
          auVar92._4_4_ = fStack_274 * fVar59 * 0.081 * fStack_134;
          auVar92._8_4_ = fStack_270 * fVar52 * 0.081 * fStack_130;
          auVar92._12_4_ = fStack_26c * fVar40 * 0.081 * fStack_12c;
          goto LAB_00188912;
        }
      }
      fVar65 = fVar65 * (float)local_1e8;
      fVar67 = fVar67 * local_1e8._4_4_;
      fVar68 = fVar68 * fStack_1e0;
      auVar77._0_12_ = auVar92._0_12_;
      if (bVar25 == 0) {
        pfVar6 = (float *)(local_2f8.field_2._8_8_ + lVar36 * 2);
        *pfVar6 = fVar65;
        pfVar6[1] = fVar67;
        pfVar6[2] = fVar68;
        pfVar6[3] = local_128;
        pfVar6 = (float *)(local_2f8.field_2._8_8_ + 0x10 + lVar36 * 2);
        *pfVar6 = fVar60;
        pfVar6[1] = fVar61;
        pfVar6[2] = fVar62;
        pfVar6[3] = local_128;
        pfVar6 = (float *)(local_2f8.field_2._8_8_ + 0x20 + lVar36 * 2);
        *pfVar6 = fVar60;
        pfVar6[1] = fVar54;
        pfVar6[2] = fVar55;
        pfVar6[3] = local_48._0_4_;
        auVar80._12_4_ = 0;
        auVar80._0_12_ = auVar77._0_12_;
        *(undefined1 (*) [16])(local_2f8.field_2._8_8_ + 0x30 + lVar36 * 2) = auVar80;
      }
      else {
        pfVar6 = (float *)(local_2f8.field_2._8_8_ + lVar36);
        *pfVar6 = fVar65;
        pfVar6[1] = fVar67;
        pfVar6[2] = fVar68;
        pfVar6[3] = local_128;
        auVar77._12_4_ = 0;
        *(undefined1 (*) [16])(local_2f8.field_2._8_8_ + 0x10 + lVar36) = auVar77;
        fVar56 = local_1d8 * local_1d8;
        fVar71 = fVar51 * fVar51;
        fVar73 = fVar56 + (float)local_188 * (float)local_188 + fVar71;
        auVar78._0_8_ = CONCAT44(fVar56 + fVar56 + 0.0,fVar73);
        auVar78._8_4_ = fVar56 + fVar71 + fVar71;
        auVar78._12_4_ = fVar56 + 0.0 + 0.0;
        auVar84._8_4_ = auVar78._8_4_;
        auVar84._0_8_ = auVar78._0_8_;
        auVar84._12_4_ = auVar78._12_4_;
        auVar85 = rsqrtss(auVar84,auVar78);
        fVar56 = auVar85._0_4_;
        fVar56 = fVar56 * 1.5 - fVar56 * fVar56 * fVar73 * 0.5 * fVar56;
        fVar71 = fVar59 * fVar59;
        fVar73 = fVar52 * fVar52;
        fVar74 = fVar40 * fVar40;
        fVar83 = fVar71 + fVar50 * fVar50 + fVar73;
        auVar86._0_8_ = CONCAT44(fVar71 + fVar71 + fVar74,fVar83);
        auVar86._8_4_ = fVar71 + fVar73 + fVar73;
        auVar86._12_4_ = fVar71 + fVar74 + fVar74;
        auVar79._8_4_ = auVar86._8_4_;
        auVar79._0_8_ = auVar86._0_8_;
        auVar79._12_4_ = auVar86._12_4_;
        auVar85 = rsqrtss(auVar79,auVar86);
        fVar71 = auVar85._0_4_;
        fVar71 = fVar71 * 1.5 - fVar71 * fVar71 * fVar83 * 0.5 * fVar71;
        pfVar6 = (float *)(local_230._64_8_ + lVar36);
        *pfVar6 = fVar56 * (float)local_188;
        pfVar6[1] = fVar56 * local_1d8;
        pfVar6[2] = fVar56 * fVar51;
        pfVar6[3] = 0.2;
        pfVar6 = (float *)(local_230._64_8_ + 0x10 + lVar36);
        *pfVar6 = fVar71 * fVar50;
        pfVar6[1] = fVar71 * fVar59;
        pfVar6[2] = fVar71 * fVar52;
        pfVar6[3] = 0.8;
        fVar56 = fVar59 * (float)local_188 - local_1d8 * fVar50;
        fVar73 = fVar52 * local_1d8 - fVar51 * fVar59;
        fVar74 = fVar50 * fVar51 - (float)local_188 * fVar52;
        fVar75 = fVar40 * 0.0 - fVar40 * 0.0;
        fVar71 = fVar73 * fVar73;
        fVar83 = fVar74 * fVar74;
        fVar76 = fVar75 * fVar75;
        fVar89 = fVar83 + fVar71 + fVar56 * fVar56;
        fVar90 = fVar76 + fVar71 + fVar71;
        fVar83 = fVar83 + fVar71 + fVar83;
        fVar76 = fVar76 + fVar71 + fVar76;
        auVar72._4_4_ = fVar90;
        auVar72._0_4_ = fVar89;
        auVar72._8_4_ = fVar83;
        auVar72._12_4_ = fVar76;
        auVar11._4_4_ = fVar90;
        auVar11._0_4_ = fVar89;
        auVar11._8_4_ = fVar83;
        auVar11._12_4_ = fVar76;
        auVar85 = rsqrtss(auVar72,auVar11);
        fVar71 = auVar85._0_4_;
        fVar71 = fVar71 * 1.5 - fVar71 * fVar71 * fVar89 * 0.5 * fVar71;
        pfVar6 = (float *)((long)(_func_int ***)local_268._24_8_ + lVar36);
        *pfVar6 = fVar71 * fVar73;
        pfVar6[1] = fVar71 * fVar74;
        pfVar6[2] = fVar71 * fVar56;
        pfVar6[3] = fVar71 * fVar75;
        pfVar6 = (float *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_268._24_8_ + 0x10))->_vptr__Sp_counted_base + lVar36);
        *pfVar6 = fVar71 * fVar73;
        pfVar6[1] = fVar71 * fVar74;
        pfVar6[2] = fVar71 * fVar56;
        pfVar6[3] = fVar71 * fVar75;
        if (local_308 != 0) {
          *(undefined1 (*) [16])(local_230._32_8_ + lVar36) = ZEXT416(0);
          *(undefined1 (*) [16])(local_230._32_8_ + lVar36 + 0x10) = ZEXT416(0);
        }
      }
      if (local_308 == 1 && bVar25 == 0) {
        fVar71 = (float)local_188 * fVar59 - local_1d8 * fVar50;
        fVar73 = local_1d8 * fVar52 - fVar51 * fVar59;
        fVar74 = fVar51 * fVar50 - (float)local_188 * fVar52;
        fVar75 = fVar40 * 0.0 - fVar40 * 0.0;
        fVar51 = fVar73 * fVar73;
        fVar83 = fVar74 * fVar74;
        fVar76 = fVar75 * fVar75;
        fVar56 = fVar83 + fVar51 + fVar71 * fVar71;
        auVar87._0_8_ = CONCAT44(fVar76 + fVar51 + fVar51,fVar56);
        auVar87._8_4_ = fVar83 + fVar51 + fVar83;
        auVar87._12_4_ = fVar76 + fVar51 + fVar76;
        auVar81._8_4_ = auVar87._8_4_;
        auVar81._0_8_ = auVar87._0_8_;
        auVar81._12_4_ = auVar87._12_4_;
        auVar85 = rsqrtss(auVar81,auVar87);
        fVar51 = auVar85._0_4_;
        fVar51 = fVar51 * 1.5 - fVar51 * fVar51 * fVar56 * 0.5 * fVar51;
        pfVar6 = (float *)((long)(_func_int ***)local_268._24_8_ + lVar36 * 2);
        *pfVar6 = fVar51 * fVar73;
        pfVar6[1] = fVar51 * fVar74;
        pfVar6[2] = fVar51 * fVar71;
        pfVar6[3] = fVar51 * fVar75;
        fVar51 = fVar69 * fStack_1dc - fVar63;
        fVar56 = fVar59 * (fVar65 - fVar60) - (fVar67 - fVar61) * fVar50;
        fVar67 = fVar52 * (fVar67 - fVar61) - (fVar68 - fVar62) * fVar59;
        fVar65 = fVar50 * (fVar68 - fVar62) - (fVar65 - fVar60) * fVar52;
        fVar69 = fVar40 * fVar51 - fVar51 * fVar40;
        fVar51 = fVar67 * fVar67;
        fVar68 = fVar65 * fVar65;
        fVar71 = fVar69 * fVar69;
        fVar73 = fVar68 + fVar51 + fVar56 * fVar56;
        auVar88._0_8_ = CONCAT44(fVar71 + fVar51 + fVar51,fVar73);
        auVar88._8_4_ = fVar68 + fVar51 + fVar68;
        auVar88._12_4_ = fVar71 + fVar51 + fVar71;
        auVar70._8_4_ = auVar88._8_4_;
        auVar70._0_8_ = auVar88._0_8_;
        auVar70._12_4_ = auVar88._12_4_;
        auVar85 = rsqrtss(auVar70,auVar88);
        fVar51 = auVar85._0_4_;
        fVar51 = fVar51 * 1.5 - fVar51 * fVar51 * fVar73 * 0.5 * fVar51;
        pfVar6 = (float *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_268._24_8_ + 0x10))->_vptr__Sp_counted_base + lVar36 * 2);
        *pfVar6 = fVar51 * fVar67;
        pfVar6[1] = fVar51 * fVar65;
        pfVar6[2] = fVar51 * fVar56;
        pfVar6[3] = fVar51 * fVar69;
        fVar51 = fVar59 * (fVar60 - fVar53) - (fVar61 - fVar54) * fVar50;
        fVar61 = fVar52 * (fVar61 - fVar54) - (fVar62 - fVar55) * fVar59;
        fVar60 = fVar50 * (fVar62 - fVar55) - (fVar60 - fVar53) * fVar52;
        fVar63 = fVar40 * (fVar63 - fVar64) - (fVar63 - fVar64) * fVar40;
        fVar56 = fVar61 * fVar61;
        fVar62 = fVar60 * fVar60;
        fVar65 = fVar63 * fVar63;
        fVar67 = fVar62 + fVar56 + fVar51 * fVar51;
        auVar82._0_8_ = CONCAT44(fVar65 + fVar56 + fVar56,fVar67);
        auVar82._8_4_ = fVar62 + fVar56 + fVar62;
        auVar82._12_4_ = fVar65 + fVar56 + fVar65;
        auVar66._8_4_ = auVar82._8_4_;
        auVar66._0_8_ = auVar82._0_8_;
        auVar66._12_4_ = auVar82._12_4_;
        auVar85 = rsqrtss(auVar66,auVar82);
        fVar56 = auVar85._0_4_;
        fVar56 = fVar56 * 1.5 - fVar56 * fVar56 * fVar67 * 0.5 * fVar56;
        pfVar6 = (float *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_268._24_8_ + 0x20))->_vptr__Sp_counted_base + lVar36 * 2);
        *pfVar6 = fVar56 * fVar61;
        pfVar6[1] = fVar56 * fVar60;
        pfVar6[2] = fVar56 * fVar51;
        pfVar6[3] = fVar56 * fVar63;
        fVar53 = fVar53 - auVar92._0_4_;
        fVar54 = fVar54 - auVar92._4_4_;
        fVar55 = fVar55 - auVar92._8_4_;
        fVar64 = fVar64 - auVar92._12_4_;
        fVar56 = fVar59 * fVar53 - fVar54 * fVar50;
        fVar60 = fVar52 * fVar54 - fVar55 * fVar59;
        fVar61 = fVar50 * fVar55 - fVar53 * fVar52;
        fVar62 = fVar40 * fVar64 - fVar64 * fVar40;
        fVar64 = fVar60 * fVar60;
        fVar54 = fVar61 * fVar61;
        fVar55 = fVar62 * fVar62;
        fVar53 = fVar54 + fVar64 + fVar56 * fVar56;
        fVar51 = fVar55 + fVar64 + fVar64;
        fVar54 = fVar54 + fVar64 + fVar54;
        fVar55 = fVar55 + fVar64 + fVar55;
        auVar58._4_4_ = fVar51;
        auVar58._0_4_ = fVar53;
        auVar58._8_4_ = fVar54;
        auVar58._12_4_ = fVar55;
        auVar10._4_4_ = fVar51;
        auVar10._0_4_ = fVar53;
        auVar10._8_4_ = fVar54;
        auVar10._12_4_ = fVar55;
        auVar92 = rsqrtss(auVar58,auVar10);
        fVar51 = auVar92._0_4_;
        fVar51 = fVar51 * 1.5 - fVar51 * fVar51 * fVar53 * 0.5 * fVar51;
        pfVar6 = (float *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  (local_268._24_8_ + 0x30))->_vptr__Sp_counted_base + lVar36 * 2);
        *pfVar6 = fVar51 * fVar60;
        pfVar6[1] = fVar51 * fVar61;
        pfVar6[2] = fVar51 * fVar56;
        pfVar6[3] = fVar51 * fVar62;
      }
      lVar36 = lVar36 + 0x20;
    } while (uVar42 << 5 != lVar36);
  }
  this_00 = local_1b8;
  pTVar19 = local_2d8;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::push_back(&this_02->positions,(value_type *)&local_2f8);
  paVar32 = local_150;
  _Var47._M_p = local_238._M_p;
  if (local_308 != 0) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(&this_02->normals,(value_type *)local_268);
  }
  if ((bVar25 != 0) &&
     (std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back(&this_02->tangents,(value_type *)(local_230 + 0x28)), (bVar25 & local_308) == 1))
  {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(&this_02->dnormals,(value_type *)(local_230 + 8));
  }
  this_03 = &this_02->hairs;
  if (bVar48) {
    ctx = (avector<Vec3ff> *)(long)((int)local_2a8 * 3);
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::resize(this_03,(size_type)ctx);
    sig = extraout_RDX_00;
    if ((int)local_2a8 != 0) {
      lVar36 = 0x100000001;
      sig = (Vec3fx *)0x200000002;
      ctx = (avector<Vec3ff> *)0x0;
      uVar34 = 0;
      in_R8 = (pointer)0x0;
      do {
        uVar42 = (ulong)uVar34;
        *(ulong *)((long)&in_R8->vertex +
                  (long)(this_03->
                        super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                        )._M_impl.super__Vector_impl_data._M_start) = (long)ctx + uVar42;
        *(ulong *)((long)&in_R8->vertex +
                  (long)((this_03->
                         super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1)) = lVar36 + uVar42;
        *(uchar **)
         ((long)&in_R8->vertex +
         (long)((this_03->
                super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                )._M_impl.super__Vector_impl_data._M_start + 2)) =
             (uchar *)((long)&sig->field_0 + uVar42);
        in_R8 = in_R8 + 3;
        sig = sig + 0x30000000;
        uVar34 = uVar34 + 4;
        lVar36 = lVar36 + 0x300000000;
        ctx = (avector<Vec3ff> *)((long)ctx + 0x300000000);
        paVar32 = (avector<Vec3ff> *)((long)&paVar32[-1].items + 7);
      } while (paVar32 != (avector<Vec3ff> *)0x0);
      in_R9 = 0;
      paVar32 = local_150;
    }
  }
  else {
    ctx = paVar32;
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::resize(this_03,(size_type)paVar32);
    sig = extraout_RDX_01;
    if ((int)local_2a8 != 0) {
      sig = (Vec3fx *)0x0;
      ctx = (avector<Vec3ff> *)0x0;
      do {
        in_R8 = (this_03->
                super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                )._M_impl.super__Vector_impl_data._M_start;
        in_R8[(long)ctx] =
             (Hair)((long)&sig->field_0 +
                   (ulong)((uint)((long)ctx << ((byte)local_110 & 0x3f)) & 0xfffffffe));
        ctx = (avector<Vec3ff> *)((long)ctx + 1);
        sig = sig + 0x10000000;
      } while (paVar32 != ctx);
    }
  }
  bVar25 = (byte)local_1a8[1].ptr._4_4_ | bVar24;
  siglen = (avector<Vec3ff> *)(ulong)CONCAT31(SUB43(local_1a8[1].ptr._4_4_,1),bVar25);
  if (((int)local_2a8 != 0 & bVar25) == 1) {
    lVar36 = 0;
    siglen = paVar32;
    do {
      *(float *)((long)&(this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].items[1].field_0 +
                lVar36 + 0xc) = local_128 * 0.5;
      *(float *)((long)&(this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].items[2].field_0 +
                lVar36 + 0xc) = local_128 * 0.01;
      sig = (this_00->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].items;
      puVar30 = (uchar *)((long)&sig[3].field_0 + lVar36 + 0xc);
      puVar30[0] = '\0';
      puVar30[1] = '\0';
      puVar30[2] = '\0';
      puVar30[3] = '\0';
      lVar36 = lVar36 + 0x40;
      siglen = (avector<Vec3ff> *)((long)&siglen[-1].items + 7);
    } while (siglen != (avector<Vec3ff> *)0x0);
  }
  if (bVar24 != 0) {
    local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ctx = paVar32;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_178,(size_type)paVar32);
    if ((int)local_2a8 != 0) {
      lVar36 = 0;
      do {
        local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar36] = (uint)lVar36;
        lVar36 = lVar36 + 1;
        siglen = (avector<Vec3ff> *)
                 local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (paVar32 != (avector<Vec3ff> *)lVar36);
    }
    paVar32 = (this_00->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    paVar8 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sig = extraout_RDX_02;
    if (paVar32 != paVar8) {
      do {
        ctx = paVar32;
        fix_bspline_end_points(&local_178,paVar32);
        paVar32 = paVar32 + 1;
        sig = extraout_RDX_03;
      } while (paVar32 != paVar8);
    }
    _Var47._M_p = local_238._M_p;
    if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      sig = extraout_RDX_04;
      _Var47._M_p = local_238._M_p;
    }
  }
  SceneGraph::HairSetNode::verify
            (this_00,(EVP_PKEY_CTX *)ctx,(uchar *)sig,(size_t)siglen,(uchar *)in_R8,in_R9);
  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if ((HairSetNode *)
      local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::push_back(&((GroupNode *)_Var47._M_p)->children,(value_type *)&local_178);
  }
  if ((HairSetNode *)
      local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (HairSetNode *)0x0) {
    (*(((Node *)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start)->super_RefCount)._vptr_RefCount[3])();
  }
  alignedFree((void *)local_230._32_8_);
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  local_230._32_8_ = (FILE *)0x0;
  alignedFree((void *)local_230._64_8_);
  local_230._48_8_ = (_Base_ptr)0x0;
  local_230._56_8_ = (_Base_ptr)0x0;
  local_230._64_8_ = 0;
  alignedFree((void *)local_268._24_8_);
  local_268._8_8_ = 0;
  local_268._16_8_ = (element_type *)0x0;
  local_268._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  alignedFree((void *)local_2f8.field_2._8_8_);
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_2f8.field_2._8_8_ = 0;
  (local_158->path).filename._M_dataplus._M_p = _Var47._M_p;
  (**(code **)((long)(((GroupNode *)_Var47._M_p)->super_Node).super_RefCount._vptr_RefCount + 0x10))
            (_Var47._M_p);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  (*(pTVar19->super_Node).super_RefCount._vptr_RefCount[3])(pTVar19);
  if ((long *)local_230._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_230._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  (**(code **)((long)(((GroupNode *)_Var47._M_p)->super_Node).super_RefCount._vptr_RefCount + 0x18))
            (_Var47._M_p);
  return (Ref<embree::SceneGraph::Node>)(Node *)local_158;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadFurBall(const Ref<XML>& xml)
  {
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;

    float r = (xml->parm("radius") != "") ? xml->parm_float("radius") : 10.0f;
    int slices = (xml->parm("slices") != "") ? int(xml->parm_float("slices")) : 60;
    int slabs = (xml->parm("slabs") != "") ? int(xml->parm_float("slabs")) : 60;
    int nhairs = (xml->parm("nhairs") != "") ? int(xml->parm_float("nhairs")) : 30000;
    float hairwidth = (xml->parm("hairwidth") != "") ? int(xml->parm_float("hairwidth")) : (r / 100.0f);
    float hairlength = (xml->parm("hairlength") != "") ? int(xml->parm_float("hairlength")) : (r / 10.0f);
    RTCGeometryType hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
    bool is_linear = false;
    bool is_bezier = false;
    bool is_bspline = false;
    bool is_hermite = false;
    bool is_catmulrom = false;
    bool is_normaloriented = false;
    std::string phairtype = xml->parm("hairtype");
    if (phairtype == "linear_flat")                    { hairtype = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;                  is_linear = true;                               }
    else if (phairtype == "linear_round")              { hairtype = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;                 is_linear = true;                               }
    else if (phairtype == "bezier_flat")               { hairtype = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;                  is_bezier = true;                               }
    else if (phairtype == "bezier_round")              { hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;                 is_bezier = true;                               }
    else if (phairtype == "bezier_normaloriented")     { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE;       is_bezier = true;     is_normaloriented = true; }
    else if (phairtype == "bspline_flat")              { hairtype = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;                 is_bspline = true;                              }
    else if (phairtype == "bspline_round")             { hairtype = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;                is_bspline = true;                              }
    else if (phairtype == "bspline_normaloriented")    { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE;      is_bspline = true;    is_normaloriented = true; }
    else if (phairtype == "hermite_flat")              { hairtype = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;                 is_hermite = true;                              }
    else if (phairtype == "hermite_round")             { hairtype = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;                is_hermite = true;                              }
    else if (phairtype == "hermite_normaloriented")    { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE;      is_hermite = true;    is_normaloriented = true; }
    else if (phairtype == "catmulrom_flat")            { hairtype = RTC_GEOMETRY_TYPE_FLAT_CATMULL_ROM_CURVE;             is_catmulrom = true;                            }
    else if (phairtype == "catmulrom_round")           { hairtype = RTC_GEOMETRY_TYPE_ROUND_CATMULL_ROM_CURVE;            is_catmulrom = true;                            }
    else if (phairtype == "catmulrom_normaloriented")  { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_CATMULL_ROM_CURVE;  is_catmulrom = true;  is_normaloriented = true; }
    else                                               { hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;                 is_bezier = true;                               }

    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    {
      avector<Vec3fa> data;
      data.resize(slices * (slabs - 1) + 2);
      data[0] = Vec3fa(0, -r, 0);

      float dphi = float(pi) / float(slabs);
      float dtheta = float(pi) / float(slices) * 2.0f;
      int i = 0;

      for (int slab=0; slab<slabs-1; slab++)
      {
        float phi = dphi * (slab + 1);
        for (int slice=0; slice<slices; slice++)
        {
          float theta = dtheta * slice;
          float x = r * sin(phi) * cos(theta);
          float z = r * sin(phi) * sin(theta);
          float y = r * cos(phi);
          data[i] = Vec3fa(x, y, z);
          i++;
        }
      }

      data[i++] = Vec3fa(0, r, 0);
      data[i++] = Vec3fa(0, -r, 0);
      mesh->positions.push_back(data);
    }

    {
      int top = mesh->positions.back().size() - 2;
      int bot = mesh->positions.back().size() - 1;

      for (int slice=0; slice<slices; slice++)
      {
        mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(top, slice, (slice + 1) % slices));
      }

      for (int slab=0; slab<slabs-2; slab++)
      {
        for (int slice=0; slice<slices; slice++)
        {
          int offset_a = slab * slices;
          int offset_b = (slab + 1) * slices;

          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(offset_a + slice, offset_b + slice, offset_b + (slice + 1) % slices));
          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(offset_a + slice, offset_b + (slice + 1) % slices, offset_a + (slice + 1) % slices));
        }
      }

      for (int slice=0; slice<slices; slice++)
      {
        mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(bot, bot - slices - 1 + slice, bot - slices - 1+ (slice + 1) % slices));
      }
    }

    mesh->verify();
    group->add(mesh.dynamicCast<SceneGraph::Node>());

    // generate N random hairs
    Ref<SceneGraph::HairSetNode> hairs = new SceneGraph::HairSetNode(hairtype,material,BBox1f(0,1),0);

    int N = nhairs;

    {
      // rand() is not consistent with linux/win/mac or other compilers, so we use a manual lcg (with similar seeds as used in glibc)
      uint32_t rand_int = 1234;
      uint32_t a = 1103515245;
      uint32_t c = 12345;
      uint32_t m = 1 << 31;
      auto rand_float = [&rand_int, &a, &c, &m]() {
        rand_int = (a * rand_int + c) % m;
        return rand_int / float(m);
      };

      size_t nvertices_per_curve = (is_hermite) ? 2 : 4;

      avector<Vec3ff> pos;
      avector<Vec3fa> norm;
      avector<Vec3ff> tans;
      avector<Vec3fa> dnorm;
      pos.resize(N *  nvertices_per_curve);
      norm.resize(N * nvertices_per_curve);
      if (is_hermite) {
        tans.resize(N * nvertices_per_curve);
        dnorm.resize(N * nvertices_per_curve);
      }

      float theta = 2.0f * float(pi) * rand_float();
      float phi = acos(1 - 2 * rand_float());
      Vec3fa last = Vec3fa(sin(phi) * cos(theta), cos(phi), sin(phi) * sin(theta));

      for (int i = 0; i < N; i++) {
          float theta = 2.0f * float(pi) * rand_float();
          float phi = acos(1 - 2 * rand_float());
          Vec3fa d = Vec3fa(sin(phi) * cos(theta), cos(phi), sin(phi) * sin(theta));

          Vec3fa p = normalize(cross(d, last));
          last = p;

          Vec3fa start = d * r * (1.0f - 0.01f * hairlength);
          Vec3fa mid   = d * r * (1.0f + 0.03f * hairlength);
          Vec3fa mid2  = d * r * (1.0f + 0.07f * hairlength);
          Vec3fa stop  = d * r * (1.0f + 0.07f * hairlength + 0.03f * hairlength * rand_float());

          // Tweak positions based on curve type
          if (is_bezier) {
            stop = stop + p * r * 0.051f * hairlength;
          }
          else if (is_linear) {
            mid  = mid  + p * r * 0.001f * hairlength;
            mid2 = mid2 + p * r * 0.021f * hairlength;
            stop = stop + p * r * 0.051f * hairlength;
          }
          else if (is_bspline) {
            mid2 = mid2 + p * r * 0.021f * hairlength;
            stop  = d * r * (1.0f + 0.07f * hairlength + 0.13f * hairlength * rand_float());
            stop = stop + p * r * 0.081f * hairlength;
          }

          // Hermite only has 2 supports
          if (is_hermite) {
            pos[i*2  ] = Vec3ff(start.x, start.y, start.z, hairwidth);
            pos[i*2+1] = Vec3ff(stop.x, stop.y, stop.z, 0.0f);

            Vec3fa tstart = normalize(d);
            Vec3fa tmid = normalize(p);

            tans[i*2  ] = Vec3ff(tstart.x, tstart.y, tstart.z, 0.2f);
            tans[i*2+1] = Vec3ff(tmid.x, tmid.y, tmid.z, 0.8f);

            norm[i*2  ] = normalize(cross(d, p));
            norm[i*2+1] = normalize(cross(d, p));

            if (is_normaloriented) {
              dnorm[i*2  ] = Vec3fa(0.0f, 0.0f, 0.0f);
              dnorm[i*2+1] = Vec3fa(0.0f, 0.0f, 0.0f);
            }
          }
          else {
            pos[i*4+0] = Vec3ff(start.x, start.y, start.z, hairwidth);
            pos[i*4+1] = Vec3ff(mid.x, mid.y, mid.z, hairwidth);
            pos[i*4+2] = Vec3ff(mid.x, mid2.y, mid2.z, hairwidth * 0.5f);
            pos[i*4+3] = Vec3ff(stop.x, stop.y, stop.z, 0.0f);
          }

          // normals already added, if curve type is hermite
          if (is_normaloriented && !is_hermite) {
            norm[i*4+0] = normalize(cross(d, p));
            norm[i*4+1] = normalize(cross(start - mid, p));
            norm[i*4+2] = normalize(cross(mid - mid2, p));
            norm[i*4+3] = normalize(cross(mid2 - stop, p));
          }
      }

      hairs->positions.push_back(pos);
      if (is_normaloriented) hairs->normals.push_back(norm);
      if (is_hermite) hairs->tangents.push_back(tans);
      if (is_hermite && is_normaloriented) hairs->dnormals.push_back(dnorm);

      // linear uses 3 segments per hair
      if (is_linear) {
        hairs->hairs.resize(N * 3);
        for (size_t i=0; i<N; i++) {
          hairs->hairs[i * 3    ] = SceneGraph::HairSetNode::Hair(i * 4    , i * 3    );
          hairs->hairs[i * 3 + 1] = SceneGraph::HairSetNode::Hair(i * 4 + 1, i * 3 + 1);
          hairs->hairs[i * 3 + 2] = SceneGraph::HairSetNode::Hair(i * 4 + 2, i * 3 + 2);
        }
      }
      // rest uses nvertices_per_curve number of supports
      else {
        hairs->hairs.resize(N);
        for (size_t i=0; i<N; i++) {
          hairs->hairs[i] = SceneGraph::HairSetNode::Hair(i * nvertices_per_curve, i);
        }
      }

      // tweak hairwidth of tips to make bsplines/catmulrom look slightly better
      if (is_bspline || is_catmulrom) {
        for (size_t i=0; i<N; i++) { 
          hairs->positions.back()[i * 4 + 1].w = 0.5f * hairwidth;
          hairs->positions.back()[i * 4 + 2].w = 0.01f * hairwidth;
          hairs->positions.back()[i * 4 + 3].w = 0.0f;
        }
      }

      if (is_bspline) {
        std::vector<unsigned> indices;
        indices.resize(N);
        for (size_t i=0; i<N; i++) { indices[i] = i; }
        for (auto& vertices : hairs->positions)
          fix_bspline_end_points(indices,vertices);
      }

      hairs->verify();
      group->add(hairs.dynamicCast<SceneGraph::Node>());
    }

    return group.dynamicCast<SceneGraph::Node>();
  }